

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<long_const&,int_const&>
               (string *s,char *fmt,long *v,int *args)

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  long *in_RDX;
  string *in_RDI;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  long *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string *psVar3;
  string *in_stack_fffffffffffffd90;
  string local_268 [8];
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string local_220 [32];
  stringstream local_200 [16];
  undefined1 local_1f0 [8];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  string local_78 [32];
  undefined4 local_58;
  undefined1 local_43;
  byte local_42;
  byte local_41;
  string local_40 [16];
  int *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)local_40,0x2a);
  local_41 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_40,0x73);
  local_42 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_40,100);
  local_43 = lVar1 != -1;
  if ((local_41 & 1) == 0) {
    if ((bool)local_43) {
      psVar3 = local_40;
      uVar2 = std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<long>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_78);
      std::__cxx11::string::~string(local_78);
    }
    else if ((local_42 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 in_stack_fffffffffffffe18);
      }
      std::__cxx11::string::c_str();
      formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_268);
      std::__cxx11::string::~string(local_268);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_200);
      std::ostream::operator<<(local_1f0,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_220);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
    stringPrintfRecursive<int_const&>(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    local_58 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<long_const&,int_const&>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78,(int *)0x8e041d);
    local_58 = 1;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}